

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceField.hpp
# Opt level: O1

void __thiscall OpenMD::ForceField::~ForceField(ForceField *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  this->_vptr_ForceField = (_func_int **)&PTR__ForceField_0022c178;
  pcVar2 = (this->forceFieldFileName_)._M_dataplus._M_p;
  paVar1 = &(this->forceFieldFileName_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->wildCardAtomTypeName_)._M_dataplus._M_p;
  paVar1 = &(this->wildCardAtomTypeName_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->ffPath_)._M_dataplus._M_p;
  paVar1 = &(this->ffPath_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  SectionParserManager::~SectionParserManager(&this->spMan_);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->atypeIdentToName)._M_t);
  ForceFieldOptions::~ForceFieldOptions(&this->forceFieldOptions_);
  TypeContainer<OpenMD::NonBondedInteractionType,_2>::~TypeContainer
            (&this->nonBondedInteractionTypeCont_);
  TypeContainer<OpenMD::InversionType,_4>::~TypeContainer(&this->inversionTypeCont_);
  TypeContainer<OpenMD::TorsionType,_4>::~TypeContainer(&this->torsionTypeCont_);
  TypeContainer<OpenMD::BendType,_3>::~TypeContainer(&this->bendTypeCont_);
  TypeContainer<OpenMD::BondType,_2>::~TypeContainer(&this->bondTypeCont_);
  TypeContainer<OpenMD::AtomType,_1>::~TypeContainer(&this->atomTypeCont_);
  return;
}

Assistant:

virtual ~ForceField() = default;